

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateBooleanNegate(Lowerer *this,Instr *instr,Opnd *srcBool,Opnd *dst)

{
  int iVar1;
  int iVar2;
  ScriptContextInfo *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AddrOpnd *src2;
  AddrOpnd *xorval;
  ScriptContextInfo *sci;
  Opnd *dst_local;
  Opnd *srcBool_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  InsertMove(dst,srcBool,instr,true);
  pSVar3 = Func::GetScriptContextInfo(instr->m_func);
  iVar1 = (*pSVar3->_vptr_ScriptContextInfo[2])();
  iVar2 = (*pSVar3->_vptr_ScriptContextInfo[3])();
  src2 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar1) ^ CONCAT44(extraout_var_00,iVar2),
                           AddrOpndKindDynamicMisc,instr->m_func,true,(Var)0x0);
  InsertXor(dst,dst,&src2->super_Opnd,instr);
  return;
}

Assistant:

void Lowerer::GenerateBooleanNegate(IR::Instr * instr, IR::Opnd * srcBool, IR::Opnd * dst)
{
    // dst = src
    // dst = dst ^ (true ^ false) (= !src)
    Lowerer::InsertMove(dst, srcBool, instr);
    ScriptContextInfo* sci = instr->m_func->GetScriptContextInfo();
    IR::AddrOpnd* xorval = IR::AddrOpnd::New(sci->GetTrueAddr() ^ sci->GetFalseAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func, true);
    InsertXor(dst, dst, xorval, instr);
}